

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O2

void I422ToUYVYRow_AVX2(uint8_t *src_y,uint8_t *src_u,uint8_t *src_v,uint8_t *dst_uyvy,int width)

{
  bool bVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  long lVar4;
  int iVar5;
  undefined1 auVar6 [32];
  int width_local;
  
  lVar4 = (long)src_v - (long)src_u;
  do {
    auVar2 = vpmovzxbw_avx2(*(undefined1 (*) [16])src_u);
    auVar6 = vpmovzxbw_avx2(*(undefined1 (*) [16])((long)src_u + lVar4));
    src_u = (uint8_t *)((long)src_u + 0x10);
    auVar6 = vpsllw_avx2(auVar6,8);
    auVar6 = vpor_avx2(auVar6,auVar2);
    auVar2 = *(undefined1 (*) [32])src_y;
    src_y = (uint8_t *)((long)src_y + 0x20);
    auVar3 = vpunpcklbw_avx2(auVar6,auVar2);
    auVar2 = vpunpckhbw_avx2(auVar6,auVar2);
    *(undefined1 (*) [16])dst_uyvy = auVar3._0_16_;
    *(undefined1 (*) [16])((long)dst_uyvy + 0x10) = auVar2._0_16_;
    *(undefined1 (*) [16])((long)dst_uyvy + 0x20) = auVar3._16_16_;
    *(undefined1 (*) [16])((long)dst_uyvy + 0x30) = auVar2._16_16_;
    dst_uyvy = (uint8_t *)((long)dst_uyvy + 0x40);
    iVar5 = width + -0x20;
    bVar1 = 0x1f < width;
    width = iVar5;
  } while (iVar5 != 0 && bVar1);
  return;
}

Assistant:

void I422ToUYVYRow_AVX2(const uint8_t* src_y,
                        const uint8_t* src_u,
                        const uint8_t* src_v,
                        uint8_t* dst_uyvy,
                        int width) {
  asm volatile(

      "sub         %1,%2                         \n"

      LABELALIGN
      "1:                                        \n"
      "vpmovzxbw   (%1),%%ymm1                   \n"
      "vpmovzxbw   0x00(%1,%2,1),%%ymm2          \n"
      "add         $0x10,%1                      \n"
      "vpsllw      $0x8,%%ymm2,%%ymm2            \n"
      "vpor        %%ymm1,%%ymm2,%%ymm2          \n"
      "vmovdqu     (%0),%%ymm0                   \n"
      "add         $0x20,%0                      \n"
      "vpunpcklbw  %%ymm0,%%ymm2,%%ymm1          \n"
      "vpunpckhbw  %%ymm0,%%ymm2,%%ymm2          \n"
      "vextractf128 $0x0,%%ymm1,(%3)             \n"
      "vextractf128 $0x0,%%ymm2,0x10(%3)         \n"
      "vextractf128 $0x1,%%ymm1,0x20(%3)         \n"
      "vextractf128 $0x1,%%ymm2,0x30(%3)         \n"
      "lea         0x40(%3),%3                   \n"
      "sub         $0x20,%4                      \n"
      "jg          1b                            \n"
      "vzeroupper                                \n"
      : "+r"(src_y),     // %0
        "+r"(src_u),     // %1
        "+r"(src_v),     // %2
        "+r"(dst_uyvy),  // %3
        "+rm"(width)     // %4
      :
      : "memory", "cc", "xmm0", "xmm1", "xmm2");
}